

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_extend_scanned_scalar(Parser *this,csubstr s)

{
  uint uVar1;
  State *pSVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t indentation;
  ulong sz;
  ro_substr chars;
  csubstr cVar7;
  substr s_00;
  csubstr cVar8;
  substr full;
  substr local_78;
  basic_substring<char> local_68 [3];
  
  sz = s.len;
  cVar8.str = s.str;
  pSVar2 = this->m_state;
  uVar1 = pSVar2->flags;
  if ((~uVar1 & 100) == 0) {
    if ((uVar1 & 0x10) == 0) {
      indentation = pSVar2->scalar_col;
    }
    else {
      indentation = 0;
    }
    cVar7 = _scan_to_next_nonempty_line(this,indentation);
    if (cVar7.str == (char *)0x0 || cVar7.len == 0) {
      return s;
    }
    local_78 = _scan_complex_key(this,s,cVar7);
    chars.len = 4;
    chars.str = " \t\r\n";
    s_00 = basic_substring<char>::trimr(&local_78,chars);
    local_68[0] = s_00;
    iVar5 = basic_substring<char>::compare(local_68,cVar8.str,sz);
    if (iVar5 == 0) {
      return s;
    }
  }
  else {
    if ((sz != 0) && (*cVar8.str == '*')) {
      return s;
    }
    if ((uVar1 & 0x10) == 0) {
      sVar3 = pSVar2->indref;
      indentation = sVar3;
      if (sVar3 != 0) {
        indentation = sVar3 + 1;
      }
      if ((uVar1 & 2) == 0) {
        indentation = sVar3 + 1;
      }
      cVar8 = _scan_to_next_nonempty_line(this,indentation);
      pcVar6 = cVar8.str;
      if (pcVar6 == (char *)0x0 || cVar8.len == 0) {
        return s;
      }
      sVar3 = (this->m_state->line_contents).full.len;
      if (((sVar3 == 0) || (pcVar4 = (this->m_state->line_contents).full.str, pcVar6 < pcVar4)) ||
         (pcVar4 + sVar3 < pcVar6 + cVar8.len)) {
        _extend_scanned_scalar();
      }
      s_00 = _scan_plain_scalar_blck(this,s,cVar8,indentation);
      if (s_00.len < sz) {
        return s;
      }
    }
    else {
      cVar7 = _scan_to_next_nonempty_line(this,0);
      cVar8.len = cVar7.len;
      if (cVar7.str == (char *)0x0 || cVar8.len == 0) {
        return s;
      }
      s_00 = _scan_plain_scalar_flow(this,cVar8,cVar7);
      indentation = 0;
    }
  }
  cVar8 = _filter_plain_scalar(this,s_00,indentation);
  return cVar8;
}

Assistant:

csubstr Parser::_extend_scanned_scalar(csubstr s)
{
    if(has_all(RMAP|RKEY|QMRK))
    {
        size_t scalar_indentation = has_any(FLOW) ? 0 : m_state->scalar_col;
        _c4dbgpf("extend_scalar: explicit key! indref={} scalar_indentation={} scalar_col={}", m_state->indref, scalar_indentation, m_state->scalar_col);
        csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
        if(!n.empty())
        {
            substr full = _scan_complex_key(s, n).trimr(" \t\r\n");
            if(full != s)
                s = _filter_plain_scalar(full, scalar_indentation);
        }
    }
    // deal with plain (unquoted) scalars that continue to the next line
    else if(!s.begins_with_any("*")) // cannot be a plain scalar if it starts with * (that's an anchor reference)
    {
        _c4dbgpf("extend_scalar: line ended, scalar='{}'", s);
        if(has_none(FLOW))
        {
            size_t scalar_indentation = m_state->indref + 1;
            if(has_all(RUNK) && scalar_indentation == 1)
                scalar_indentation = 0;
            csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
            if(!n.empty())
            {
                _c4dbgpf("rscalar[IMPL]: state_indref={} state_indentation={} scalar_indentation={}", m_state->indref, m_state->line_contents.indentation, scalar_indentation);
                _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.is_super(n));
                substr full = _scan_plain_scalar_blck(s, n, scalar_indentation);
                if(full.len >= s.len)
                    s = _filter_plain_scalar(full, scalar_indentation);
            }
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            csubstr n = _scan_to_next_nonempty_line(/*indentation*/0);
            if(!n.empty())
            {
                _c4dbgp("rscalar[FLOW]");
                substr full = _scan_plain_scalar_flow(s, n);
                s = _filter_plain_scalar(full, /*indentation*/0);
            }
        }
    }

    return s;
}